

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedDatum.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::FixedDatum::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,FixedDatum *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Fixed Datum:",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"\n\tID:          ",0xf);
  ENUMS::GetEnumAsStringDatumID_abi_cxx11_(&local_1c8,(ENUMS *)(ulong)this->m_ui32DatumID,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tValue(UI32): ",0xf);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

KString FixedDatum::GetAsString() const
{
    KStringStream ss;

    NetToKUINT32 NetToSys( m_cDatumValue, false );

    // TODO: maybe determine what the data type should be when printing out, this
    // could be a lot of work.
    ss << "Fixed Datum:"
       << "\n\tID:          " << GetEnumAsStringDatumID( m_ui32DatumID )
       << "\n\tValue(UI32): " << NetToSys.m_Value
       << "\n";

    return ss.str();
}